

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_RenderingVenue.cpp
# Opt level: O2

void __thiscall soul::TaskThread::Queue::addTask(Queue *this,TaskFunction *task)

{
  tuple<soul::TaskThread::Queue::TaskHolder_*,_std::default_delete<soul::TaskThread::Queue::TaskHolder>_>
  in_RAX;
  __single_object taskHolder;
  __uniq_ptr_impl<soul::TaskThread::Queue::TaskHolder,_std::default_delete<soul::TaskThread::Queue::TaskHolder>_>
  local_28;
  
  local_28._M_t.
  super__Tuple_impl<0UL,_soul::TaskThread::Queue::TaskHolder_*,_std::default_delete<soul::TaskThread::Queue::TaskHolder>_>
  .super__Head_base<0UL,_soul::TaskThread::Queue::TaskHolder_*,_false>._M_head_impl =
       (tuple<soul::TaskThread::Queue::TaskHolder_*,_std::default_delete<soul::TaskThread::Queue::TaskHolder>_>
        )(tuple<soul::TaskThread::Queue::TaskHolder_*,_std::default_delete<soul::TaskThread::Queue::TaskHolder>_>
          )in_RAX.
           super__Tuple_impl<0UL,_soul::TaskThread::Queue::TaskHolder_*,_std::default_delete<soul::TaskThread::Queue::TaskHolder>_>
           .super__Head_base<0UL,_soul::TaskThread::Queue::TaskHolder_*,_false>._M_head_impl;
  std::mutex::lock(&this->taskListLock);
  if ((this->ownerThread->shuttingDown).super___atomic_base<int>._M_i == 0) {
    std::make_unique<soul::TaskThread::Queue::TaskHolder>();
    std::function<void_(std::atomic<int>_&)>::operator=
              ((function<void_(std::atomic<int>_&)> *)
               local_28._M_t.
               super__Tuple_impl<0UL,_soul::TaskThread::Queue::TaskHolder_*,_std::default_delete<soul::TaskThread::Queue::TaskHolder>_>
               .super__Head_base<0UL,_soul::TaskThread::Queue::TaskHolder_*,_false>._M_head_impl,
               task);
    std::
    vector<std::unique_ptr<soul::TaskThread::Queue::TaskHolder,std::default_delete<soul::TaskThread::Queue::TaskHolder>>,std::allocator<std::unique_ptr<soul::TaskThread::Queue::TaskHolder,std::default_delete<soul::TaskThread::Queue::TaskHolder>>>>
    ::
    emplace_back<std::unique_ptr<soul::TaskThread::Queue::TaskHolder,std::default_delete<soul::TaskThread::Queue::TaskHolder>>>
              ((vector<std::unique_ptr<soul::TaskThread::Queue::TaskHolder,std::default_delete<soul::TaskThread::Queue::TaskHolder>>,std::allocator<std::unique_ptr<soul::TaskThread::Queue::TaskHolder,std::default_delete<soul::TaskThread::Queue::TaskHolder>>>>
                *)&this->tasks,
               (unique_ptr<soul::TaskThread::Queue::TaskHolder,_std::default_delete<soul::TaskThread::Queue::TaskHolder>_>
                *)&local_28);
    std::condition_variable::notify_all();
    std::
    unique_ptr<soul::TaskThread::Queue::TaskHolder,_std::default_delete<soul::TaskThread::Queue::TaskHolder>_>
    ::~unique_ptr((unique_ptr<soul::TaskThread::Queue::TaskHolder,_std::default_delete<soul::TaskThread::Queue::TaskHolder>_>
                   *)&local_28);
  }
  pthread_mutex_unlock((pthread_mutex_t *)&this->taskListLock);
  return;
}

Assistant:

void addTask (TaskFunction&& task)
        {
            std::lock_guard<std::mutex> l (taskListLock);

            if (ownerThread.shuttingDown)
                return;

            auto taskHolder = std::make_unique<TaskHolder>();
            taskHolder->function = std::move (task);
            tasks.emplace_back (std::move (taskHolder));
            ownerThread.checkQueues.notify_all();
        }